

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O1

void mserialize::detail::BuiltinDeserializer<std::deque<char,_std::allocator<char>_>,_void>::
     deserialize_elems_noinsert<InputStream>(long param_1,undefined8 param_2,undefined8 *param_3)

{
  long lVar1;
  long lVar2;
  long lVar3;
  char *elem;
  long lVar4;
  
  lVar4 = *(long *)(param_1 + 0x10);
  lVar1 = *(long *)(param_1 + 0x30);
  if (lVar4 != lVar1) {
    lVar3 = *(long *)(param_1 + 0x20);
    lVar2 = *(long *)(param_1 + 0x28);
    do {
      std::istream::read((char *)*param_3,lVar4);
      lVar4 = lVar4 + 1;
      if (lVar4 == lVar3) {
        lVar4 = *(long *)(lVar2 + 8);
        lVar2 = lVar2 + 8;
        lVar3 = lVar4 + 0x200;
      }
    } while (lVar4 != lVar1);
  }
  return;
}

Assistant:

static void deserialize_elems_noinsert(
    std::false_type /* no batch deserialization */,
    std::false_type /* not a proxy sequence */,
    Sequence& s, std::uint32_t /*size*/, InputStream& istream
  )
  {
    for (auto&& elem : s)
    {
      mserialize::deserialize(elem, istream);
    }
  }